

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O2

LLVMValueRef CompileLlvmSwitch(LlvmCompilationContext *ctx,ExprSwitch *node)

{
  ExprBase *pEVar1;
  ExprSwitch *node_00;
  TypeBase *type;
  uint uVar2;
  IntrusiveList<ExprBase> *pIVar3;
  IntrusiveList<ExprBase> *pIVar4;
  IntrusiveList<ExprBase> *pIVar5;
  LoopInfo local_178;
  ExprSwitch *local_168;
  SmallArray<LLVMBasicBlockRefOpaque_*,_16U> conditionBlocks;
  SmallArray<LLVMBasicBlockRefOpaque_*,_16U> caseBlocks;
  
  CompileLlvm(ctx,node->condition);
  conditionBlocks.allocator = ctx->allocator;
  conditionBlocks.data = conditionBlocks.little;
  conditionBlocks.count = 0;
  conditionBlocks.max = 0x10;
  caseBlocks.data = caseBlocks.little;
  caseBlocks.count = 0;
  caseBlocks.max = 0x10;
  pIVar5 = &node->cases;
  pIVar4 = pIVar5;
  caseBlocks.allocator = conditionBlocks.allocator;
  while (pEVar1 = pIVar4->head, pEVar1 != (ExprBase *)0x0) {
    local_178.breakBlock = (LLVMBasicBlockRef)&placeholderBasicBlock;
    SmallArray<LLVMBasicBlockRefOpaque_*,_16U>::push_back(&conditionBlocks,&local_178.breakBlock);
    pIVar4 = (IntrusiveList<ExprBase> *)&pEVar1->next;
  }
  pIVar4 = &node->blocks;
  pIVar3 = pIVar4;
  local_168 = node;
  while (pEVar1 = pIVar3->head, pEVar1 != (ExprBase *)0x0) {
    local_178.breakBlock = (LLVMBasicBlockRef)&placeholderBasicBlock;
    SmallArray<LLVMBasicBlockRefOpaque_*,_16U>::push_back(&caseBlocks,&local_178.breakBlock);
    pIVar3 = (IntrusiveList<ExprBase> *)&pEVar1->next;
  }
  uVar2 = 0;
  if (conditionBlocks.count != 0) goto LAB_0017768e;
  do {
    do {
      pEVar1 = pIVar5->head;
      if (pEVar1 == (ExprBase *)0x0) {
        local_178.breakBlock = (LLVMBasicBlockRef)&placeholderBasicBlock;
        local_178.continueBlock = (LLVMBasicBlockRef)0x0;
        SmallArray<LlvmCompilationContext::LoopInfo,_32U>::push_back(&ctx->loopInfo,&local_178);
        uVar2 = 1;
        while (node_00 = local_168, pEVar1 = pIVar4->head, pEVar1 != (ExprBase *)0x0) {
          SmallArray<LLVMBasicBlockRefOpaque_*,_16U>::operator[](&caseBlocks,uVar2 - 1);
          CompileLlvm(ctx,pEVar1);
          if (pEVar1->next != (ExprBase *)0x0) {
            SmallArray<LLVMBasicBlockRefOpaque_*,_16U>::operator[](&caseBlocks,uVar2);
          }
          uVar2 = uVar2 + 1;
          pIVar4 = (IntrusiveList<ExprBase> *)&pEVar1->next;
        }
        if (local_168->defaultBlock != (ExprBase *)0x0) {
          CompileLlvm(ctx,local_168->defaultBlock);
        }
        SmallArray<LlvmCompilationContext::LoopInfo,_32U>::pop_back(&ctx->loopInfo);
        CheckType(ctx,&node_00->super_ExprBase,(LLVMValueRef)0x0);
        SmallArray<LLVMBasicBlockRefOpaque_*,_16U>::~SmallArray(&caseBlocks);
        SmallArray<LLVMBasicBlockRefOpaque_*,_16U>::~SmallArray(&conditionBlocks);
        return (LLVMValueRef)0x0;
      }
      SmallArray<LLVMBasicBlockRefOpaque_*,_16U>::operator[](&conditionBlocks,uVar2);
      CompileLlvm(ctx,pEVar1);
      type = GetStackType(ctx,pEVar1->type);
      CompileLlvmType(ctx,type);
      SmallArray<LLVMBasicBlockRefOpaque_*,_16U>::operator[](&caseBlocks,uVar2);
      pIVar5 = (IntrusiveList<ExprBase> *)&pEVar1->next;
      uVar2 = uVar2 + 1;
    } while (pEVar1->next == (ExprBase *)0x0);
LAB_0017768e:
    SmallArray<LLVMBasicBlockRefOpaque_*,_16U>::operator[](&conditionBlocks,uVar2);
  } while( true );
}

Assistant:

LLVMValueRef CompileLlvmSwitch(LlvmCompilationContext &ctx, ExprSwitch *node)
{
	CompileLlvm(ctx, node->condition);

	SmallArray<LLVMBasicBlockRef, 16> conditionBlocks(ctx.allocator);
	SmallArray<LLVMBasicBlockRef, 16> caseBlocks(ctx.allocator);

	// Generate blocks for all cases
	for(ExprBase *curr = node->cases.head; curr; curr = curr->next)
		conditionBlocks.push_back(LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "switch_case"));

	// Generate blocks for all cases
	for(ExprBase *curr = node->blocks.head; curr; curr = curr->next)
		caseBlocks.push_back(LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "case_block"));

	LLVMBasicBlockRef defaultBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "default_block");
	LLVMBasicBlockRef exitBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "switch_exit");

	LLVMBuildBr(ctx.builder, conditionBlocks.empty() ? defaultBlock : conditionBlocks[0]);

	unsigned i;

	// Generate code for all conditions
	i = 0;
	for(ExprBase *curr = node->cases.head; curr; curr = curr->next, i++)
	{
		LLVMPositionBuilderAtEnd(ctx.builder, conditionBlocks[i]);

		LLVMValueRef condition = CompileLlvm(ctx, curr);

		condition = LLVMBuildICmp(ctx.builder, LLVMIntNE, condition, LLVMConstInt(CompileLlvmType(ctx, GetStackType(ctx, curr->type)), 0, true), "");

		LLVMBuildCondBr(ctx.builder, condition, caseBlocks[i], curr->next ? conditionBlocks[i + 1] : defaultBlock);
	}

	ctx.loopInfo.push_back(LlvmCompilationContext::LoopInfo(exitBlock, NULL));

	// Generate code for all cases
	i = 0;
	for(ExprBase *curr = node->blocks.head; curr; curr = curr->next, i++)
	{
		LLVMPositionBuilderAtEnd(ctx.builder, caseBlocks[i]);

		CompileLlvm(ctx, curr);

		LLVMBuildBr(ctx.builder, curr->next ? caseBlocks[i + 1] : defaultBlock);
	}

	// Create default block
	LLVMPositionBuilderAtEnd(ctx.builder, defaultBlock);

	if(node->defaultBlock)
		CompileLlvm(ctx, node->defaultBlock);

	LLVMBuildBr(ctx.builder, exitBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, exitBlock);

	ctx.loopInfo.pop_back();

	return CheckType(ctx, node, NULL);
}